

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int init_mixw(float32 **mixw,vector_t **mean,uint32 n_density,uint32 *veclen,uint32 n_frame,
             uint32 n_stream,codew_t *label)

{
  int *piVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  pvVar2 = __ckd_calloc__((ulong)n_density,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x36b);
  for (uVar3 = 0; uVar3 != n_stream; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; n_frame != uVar4; uVar4 = uVar4 + 1) {
      piVar1 = (int *)((long)pvVar2 + (ulong)label[uVar4] * 4);
      *piVar1 = *piVar1 + 1;
    }
    for (uVar4 = 0; n_density != uVar4; uVar4 = uVar4 + 1) {
      mixw[uVar3][uVar4] = (float32)((float)*(uint *)((long)pvVar2 + uVar4 * 4) / (float)n_frame);
    }
  }
  return 0;
}

Assistant:

int
init_mixw(float32 **mixw,
	  vector_t **mean,
	  uint32 n_density,
	  const uint32 *veclen,
	  uint32 n_frame,
	  uint32 n_stream,
	  codew_t *label)
{
    uint32 s;
    uint32 *occ_cnt;
    uint32 i;

    occ_cnt = ckd_calloc(n_density, sizeof(uint32));

    for (s = 0; s < n_stream; s++) {
	for (i = 0; i < n_frame; i++) {
	    occ_cnt[label[i]]++;
	}

	for (i = 0; i < n_density; i++) {
	    mixw[s][i] = (float32)occ_cnt[i] / (float32)n_frame;
	}
    }
    return 0;
}